

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-x509.c
# Opt level: O0

int lws_tls_peer_cert_info
              (lws *wsi,lws_tls_cert_info type,lws_tls_cert_info_results *buf,size_t len)

{
  lws *plVar1;
  X509 *a;
  long lVar2;
  X509 *x509;
  int rc;
  size_t len_local;
  lws_tls_cert_info_results *buf_local;
  lws_tls_cert_info type_local;
  lws *wsi_local;
  
  x509._4_4_ = 0;
  plVar1 = lws_get_network_wsi(wsi);
  a = (X509 *)SSL_get1_peer_certificate((plVar1->tls).ssl);
  if (a == (X509 *)0x0) {
    _lws_log(0x10,"no peer cert\n");
    wsi_local._4_4_ = -1;
  }
  else {
    if (type == LWS_TLS_CERT_INFO_VERIFIED) {
      lVar2 = SSL_get_verify_result((SSL *)(plVar1->tls).ssl);
      *(uint *)buf = (uint)(lVar2 == 0);
    }
    else {
      x509._4_4_ = lws_tls_openssl_cert_info((X509 *)a,type,buf,len);
    }
    X509_free(a);
    wsi_local._4_4_ = x509._4_4_;
  }
  return wsi_local._4_4_;
}

Assistant:

int
lws_tls_peer_cert_info(struct lws *wsi, enum lws_tls_cert_info type,
		       union lws_tls_cert_info_results *buf, size_t len)
{
	int rc = 0;
	X509 *x509;

	wsi = lws_get_network_wsi(wsi);

	x509 = SSL_get_peer_certificate(wsi->tls.ssl);

	if (!x509) {
		lwsl_debug("no peer cert\n");

		return -1;
	}

	switch (type) {
	case LWS_TLS_CERT_INFO_VERIFIED:
		buf->verified = SSL_get_verify_result(wsi->tls.ssl) ==
					X509_V_OK;
		break;
	default:
		rc = lws_tls_openssl_cert_info(x509, type, buf, len);
	}

	X509_free(x509);

	return rc;
}